

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

bool __thiscall
RealtimeHelper::playMIDIShortMessageRealtime(RealtimeHelper *this,Bit32u msg,quint64 timestamp)

{
  Synth *this_00;
  bool bVar1;
  Bit32u timestamp_00;
  bool local_51;
  undefined1 local_30 [8];
  RealtimeLocker midiLocker;
  quint64 timestamp_local;
  Bit32u msg_local;
  RealtimeHelper *this_local;
  
  midiLocker._8_8_ = timestamp;
  RealtimeLocker::RealtimeLocker((RealtimeLocker *)local_30,this->qsynth->midiMutex);
  bVar1 = RealtimeLocker::isLocked((RealtimeLocker *)local_30);
  local_51 = false;
  if (bVar1) {
    bVar1 = QSynth::isOpen(this->qsynth);
    local_51 = false;
    if (bVar1) {
      this_00 = this->qsynth->synth;
      timestamp_00 = QSynth::convertOutputToSynthTimestamp(this->qsynth,midiLocker._8_8_);
      local_51 = MT32Emu::Synth::playMsg(this_00,msg,timestamp_00);
    }
  }
  RealtimeLocker::~RealtimeLocker((RealtimeLocker *)local_30);
  return local_51;
}

Assistant:

bool playMIDIShortMessageRealtime(Bit32u msg, quint64 timestamp) const {
		RealtimeLocker midiLocker(*qsynth.midiMutex);
		return midiLocker.isLocked() && qsynth.isOpen() && qsynth.synth->playMsg(msg, qsynth.convertOutputToSynthTimestamp(timestamp));
	}